

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datamanager.cpp
# Opt level: O0

int DataManager::getLinkNodes(int index,int *fromNode,int *toNode,Network *nw)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *__to;
  char *__to_00;
  Network *nw_local;
  int *toNode_local;
  int *fromNode_local;
  int index_local;
  
  *fromNode = -1;
  *toNode = -1;
  if ((-1 < index) && (iVar1 = Network::count(nw,LINK), index < iVar1)) {
    iVar1 = Network::link(nw,(char *)(ulong)(uint)index,__to);
    *fromNode = *(int *)(*(long *)(CONCAT44(extraout_var,iVar1) + 0x30) + 0x28);
    iVar1 = Network::link(nw,(char *)(ulong)(uint)index,__to_00);
    *toNode = *(int *)(*(long *)(CONCAT44(extraout_var_00,iVar1) + 0x38) + 0x28);
    return 0;
  }
  return 0xcd;
}

Assistant:

int DataManager::getLinkNodes(int index, int* fromNode, int* toNode, Network* nw)
{
    *fromNode = -1;
    *toNode = -1;
    if ( index < 0 || index >= nw->count(Element::LINK) ) return 205;
    *fromNode = nw->link(index)->fromNode->index;
    *toNode = nw->link(index)->toNode->index;
    return 0;
}